

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi__start_write_file(stbi__write_context *s,char *filename)

{
  FILE *context;
  FILE *f;
  char *filename_local;
  stbi__write_context *s_local;
  
  context = fopen(filename,"wb");
  stbi__start_write_callbacks(s,stbi__stdio_write,context);
  return (int)(context != (FILE *)0x0);
}

Assistant:

static int stbi__start_write_file(stbi__write_context *s, const char *filename)
{
   FILE *f;
#ifdef STBI_MSC_SECURE_CRT
   if (fopen_s(&f, filename, "wb"))
      f = NULL;
#else
   f = fopen(filename, "wb");
#endif
   stbi__start_write_callbacks(s, stbi__stdio_write, (void *) f);
   return f != NULL;
}